

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O1

void Fxch_ManUpdate(Fxch_Man_t *pFxchMan,int iDiv)

{
  byte *pbVar1;
  int *piVar2;
  uint uVar3;
  Hsh_VecMan_t *pHVar4;
  uint *puVar5;
  Vec_Wec_t *pVVar6;
  Vec_Wec_t *pVVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Vec_Int_t *pVVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  Vec_Int_t *pVVar15;
  Vec_Int_t *pVVar16;
  Vec_Int_t *pVVar17;
  ulong uVar18;
  uint uVar19;
  int *piVar20;
  int iVar21;
  size_t sVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  int *piVar29;
  long lVar30;
  int *piVar31;
  long lVar32;
  int *piVar33;
  bool bVar34;
  
  pVVar15 = pFxchMan->vDiv;
  pVVar15->nSize = 0;
  if (iDiv < 0) {
LAB_004c1d44:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pHVar4 = pFxchMan->pDivHash;
  if (pHVar4->vMap->nSize <= iDiv) goto LAB_004c1d44;
  iVar11 = pHVar4->vMap->pArray[(uint)iDiv];
  if (((long)iVar11 < 0) || (pHVar4->vData->nSize <= iVar11)) {
LAB_004c1d82:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
  piVar9 = pHVar4->vData->pArray + iVar11;
  iVar11 = *piVar9;
  (pHVar4->vTemp).nCap = iVar11;
  (pHVar4->vTemp).nSize = iVar11;
  (pHVar4->vTemp).pArray = piVar9 + 2;
  if (0 < iVar11) {
    lVar32 = 0;
    do {
      Vec_IntPush(pVVar15,(pHVar4->vTemp).pArray[lVar32]);
      lVar32 = lVar32 + 1;
    } while (lVar32 < (pHVar4->vTemp).nSize);
  }
  pVVar15 = pFxchMan->vCubesS;
  pVVar15->nSize = 0;
  uVar25 = 0xffffffff;
  uVar19 = 0xffffffff;
  if (pFxchMan->vDiv->nSize == 2) {
    puVar5 = (uint *)pFxchMan->vDiv->pArray;
    uVar19 = *puVar5;
    if (((int)uVar19 < 0) || (uVar25 = puVar5[1], (int)uVar25 < 0)) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
    uVar19 = uVar19 >> 1;
    pVVar6 = pFxchMan->vLits;
    uVar18 = (ulong)uVar19 ^ 1;
    if (pVVar6->nSize <= (int)uVar18) goto LAB_004c1d25;
    pVVar7 = pFxchMan->vCubes;
    pVVar8 = pVVar6->pArray;
    uVar12 = pVVar8[uVar18].nSize;
    uVar26 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar23 = 0;
    }
    else {
      piVar9 = pVVar8[uVar18].pArray;
      lVar32 = 0;
      uVar23 = 0;
      do {
        iVar11 = piVar9[lVar32];
        if (((long)iVar11 < 0) || (pVVar7->nSize <= iVar11)) goto LAB_004c1d25;
        if (0 < pVVar7->pArray[iVar11].nSize) {
          if (((int)uVar23 < 0) || ((int)uVar26 <= (int)uVar23)) goto LAB_004c1ddf;
          uVar26 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
          piVar9[uVar26] = iVar11;
        }
        lVar32 = lVar32 + 1;
        uVar12 = pVVar8[uVar18].nSize;
        uVar26 = (ulong)(int)uVar12;
      } while (lVar32 < (long)uVar26);
    }
    if ((int)uVar12 < (int)uVar23) goto LAB_004c1e3c;
    uVar25 = uVar25 >> 1;
    pVVar8[uVar18].nSize = uVar23;
    uVar26 = (ulong)uVar25 ^ 1;
    if (pVVar6->nSize <= (int)uVar26) goto LAB_004c1d25;
    uVar12 = pVVar8[uVar26].nSize;
    uVar27 = (ulong)uVar12;
    if ((int)uVar12 < 1) {
      uVar23 = 0;
    }
    else {
      piVar9 = pVVar8[uVar26].pArray;
      lVar32 = 0;
      uVar23 = 0;
      do {
        iVar11 = piVar9[lVar32];
        if (((long)iVar11 < 0) || (pVVar7->nSize <= iVar11)) goto LAB_004c1d25;
        if (0 < pVVar7->pArray[iVar11].nSize) {
          if (((int)uVar23 < 0) || ((int)uVar27 <= (int)uVar23)) {
LAB_004c1ddf:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          uVar27 = (ulong)uVar23;
          uVar23 = uVar23 + 1;
          piVar9[uVar27] = iVar11;
        }
        lVar32 = lVar32 + 1;
        uVar12 = pVVar8[uVar26].nSize;
        uVar27 = (ulong)(int)uVar12;
      } while (lVar32 < (long)uVar27);
    }
    if ((int)uVar12 < (int)uVar23) goto LAB_004c1e3c;
    pVVar8[uVar26].nSize = uVar23;
    if ((pVVar6->nSize <= (int)uVar18) || (pVVar6->nSize <= (int)uVar26)) goto LAB_004c1d25;
    piVar31 = pVVar8[uVar18].pArray;
    piVar20 = pVVar8[uVar26].pArray;
    iVar11 = pVVar8[uVar18].nSize;
    piVar9 = piVar31 + iVar11;
    piVar2 = piVar20 + (int)uVar23;
    pVVar15->nSize = 0;
    piVar29 = piVar20;
    piVar33 = piVar31;
    if ((0 < (int)uVar23) && (0 < iVar11)) {
      do {
        iVar11 = *piVar33;
        iVar13 = *piVar20;
        if (iVar11 == iVar13) {
          Vec_IntPush(pVVar15,iVar11);
          piVar33 = piVar33 + 1;
          piVar20 = piVar20 + 1;
        }
        else if (iVar11 < iVar13) {
          piVar33 = piVar33 + 1;
          *piVar31 = iVar11;
          piVar31 = piVar31 + 1;
        }
        else {
          piVar20 = piVar20 + 1;
          *piVar29 = iVar13;
          piVar29 = piVar29 + 1;
        }
      } while ((piVar33 < piVar9) && (piVar20 < piVar2));
    }
    for (; piVar33 < piVar9; piVar33 = piVar33 + 1) {
      *piVar31 = *piVar33;
      piVar31 = piVar31 + 1;
    }
    for (; piVar20 < piVar2; piVar20 = piVar20 + 1) {
      *piVar29 = *piVar20;
      piVar29 = piVar29 + 1;
    }
    iVar11 = (int)((ulong)((long)piVar31 - (long)pVVar8[uVar18].pArray) >> 2);
    if (pVVar8[uVar18].nSize < iVar11) {
LAB_004c1e3c:
      __assert_fail("p->nSize >= nSizeNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x2b7,"void Vec_IntShrink(Vec_Int_t *, int)");
    }
    pVVar8[uVar18].nSize = iVar11;
    iVar11 = (int)((ulong)((long)piVar29 - (long)pVVar8[uVar26].pArray) >> 2);
    if (pVVar8[uVar26].nSize < iVar11) goto LAB_004c1e3c;
    pVVar8[uVar26].nSize = iVar11;
  }
  pVVar15 = pFxchMan->vPairs;
  pVVar15->nSize = 0;
  if (pFxchMan->vDivCubePairs->nSize <= iDiv) {
LAB_004c1d25:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                  ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  pVVar17 = pFxchMan->vDivCubePairs->pArray;
  pVVar8 = pVVar17 + (uint)iDiv;
  if (0 < pVVar17[(uint)iDiv].nSize) {
    lVar32 = 0;
    do {
      Vec_IntPush(pVVar15,pVVar8->pArray[lVar32]);
      lVar32 = lVar32 + 1;
    } while (lVar32 < pVVar8->nSize);
  }
  if (pVVar8->pArray != (int *)0x0) {
    free(pVVar8->pArray);
    pVVar8->pArray = (int *)0x0;
  }
  pVVar8->nCap = 0;
  pVVar8->nSize = 0;
  pVVar15 = pFxchMan->vPairs;
  uVar12 = pVVar15->nSize;
  if (1 < (int)uVar12) {
    lVar32 = 0;
    do {
      iVar11 = pVVar15->pArray[lVar32];
      lVar30 = (long)iVar11;
      if (lVar30 < 0) goto LAB_004c1d25;
      iVar13 = pFxchMan->vCubes->nSize;
      if (iVar13 <= iVar11) goto LAB_004c1d25;
      pVVar8 = pFxchMan->vCubes->pArray;
      if (pVVar8[lVar30].nSize < 1) goto LAB_004c1d44;
      uVar12 = pVVar15->pArray[lVar32 + 1];
      if (((int)uVar12 < 0) || (iVar13 <= (int)uVar12)) goto LAB_004c1d25;
      if (pVVar8[uVar12].nSize < 1) goto LAB_004c1d44;
      if (*pVVar8[lVar30].pArray != *pVVar8[uVar12].pArray) {
        __assert_fail("Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                      ,0x26f,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
      }
      iVar13 = (int)lVar32;
      if ((int)uVar12 < iVar11) {
        Vec_IntSetEntry(pVVar15,iVar13,uVar12);
        Vec_IntSetEntry(pFxchMan->vPairs,iVar13 + 1,iVar11);
      }
      lVar32 = lVar32 + 2;
      pVVar15 = pFxchMan->vPairs;
      uVar12 = pVVar15->nSize;
    } while (iVar13 + 3 < (int)uVar12);
  }
  if ((uVar12 & 1) != 0) {
LAB_004c1e5b:
    __assert_fail("p->nSize % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x5da,"int Vec_IntUniqifyPairs(Vec_Int_t *)");
  }
  if (3 < (int)uVar12) {
    qsort(pVVar15->pArray,(ulong)(uVar12 >> 1),8,Vec_IntSortCompare1);
    iVar11 = 2;
    if (3 < pVVar15->nSize) {
      piVar9 = pVVar15->pArray;
      iVar11 = 1;
      lVar32 = 1;
      do {
        if ((piVar9[lVar32 * 2] != piVar9[lVar32 * 2 + -2]) ||
           (piVar9[lVar32 * 2 + 1] != piVar9[lVar32 * 2 + -1])) {
          piVar9[iVar11 * 2] = piVar9[lVar32 * 2];
          piVar9[iVar11 * 2 + 1] = piVar9[lVar32 * 2 + 1];
          iVar11 = iVar11 + 1;
        }
        lVar32 = lVar32 + 1;
      } while (lVar32 < pVVar15->nSize / 2);
      iVar11 = iVar11 * 2;
    }
    pVVar15->nSize = iVar11;
  }
  if ((pFxchMan->vPairs->nSize & 1) != 0) {
    __assert_fail("Vec_IntSize( pFxchMan->vPairs ) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                  ,0x278,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  pVVar15 = pFxchMan->vCubesS;
  if (0 < pVVar15->nSize) {
    lVar32 = 0;
    do {
      iVar11 = pVVar15->pArray[lVar32];
      lVar30 = (long)iVar11;
      Fxch_ManDivSingleCube(pFxchMan,iVar11,0,1);
      if ((lVar30 < 0) || (pFxchMan->vCubes->nSize <= iVar11)) goto LAB_004c1d25;
      pVVar15 = pFxchMan->vCubes->pArray;
      if (pVVar15[lVar30].nSize < 1) goto LAB_004c1d44;
      if (*pVVar15[lVar30].pArray == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar11,0,1);
      }
      lVar32 = lVar32 + 1;
      pVVar15 = pFxchMan->vCubesS;
    } while (lVar32 < pVVar15->nSize);
  }
  pVVar15 = pFxchMan->vPairs;
  if (0 < pVVar15->nSize) {
    lVar32 = 0;
    do {
      iVar11 = pVVar15->pArray[lVar32];
      lVar30 = (long)iVar11;
      Fxch_ManDivSingleCube(pFxchMan,iVar11,0,1);
      if ((lVar30 < 0) || (pFxchMan->vCubes->nSize <= iVar11)) goto LAB_004c1d25;
      pVVar15 = pFxchMan->vCubes->pArray;
      if (pVVar15[lVar30].nSize < 1) goto LAB_004c1d44;
      if (*pVVar15[lVar30].pArray == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar11,0,1);
      }
      lVar32 = lVar32 + 1;
      pVVar15 = pFxchMan->vPairs;
    } while (lVar32 < pVVar15->nSize);
  }
  pFxchMan->vCubesToUpdate->nSize = 0;
  iVar11 = Fxch_DivIsNotConstant1(pFxchMan->vDiv);
  if (iVar11 == 0) {
    iVar11 = 0;
  }
  else {
    iVar11 = pFxchMan->nVars;
    pFxchMan->nVars = iVar11 + 1;
    if (0 < pFxchMan->nSizeOutputID) {
      piVar9 = pFxchMan->pTempOutputID;
      lVar32 = 0;
      do {
        piVar9[lVar32] = 0;
        lVar32 = lVar32 + 1;
      } while (lVar32 < pFxchMan->nSizeOutputID);
    }
    pVVar15 = pFxchMan->vLitHashKeys;
    uVar12 = Gia_ManRandom(0);
    Vec_IntPush(pVVar15,uVar12 & 0x3ffffff);
    pVVar15 = pFxchMan->vLitHashKeys;
    uVar12 = Gia_ManRandom(0);
    Vec_IntPush(pVVar15,uVar12 & 0x3ffffff);
    pVVar15 = Vec_WecPushLevel(pFxchMan->vCubes);
    Vec_IntPush(pVVar15,iVar11);
    iVar13 = pFxchMan->nSizeOutputID;
    if (0 < (long)iVar13) {
      pVVar8 = pFxchMan->vOutputID;
      piVar9 = pFxchMan->pTempOutputID;
      lVar32 = 0;
      do {
        Vec_IntPush(pVVar8,piVar9[lVar32]);
        lVar32 = lVar32 + 1;
      } while (iVar13 != lVar32);
    }
    if (pFxchMan->vDiv->nSize == 2) {
      uVar12 = uVar25;
      if ((int)uVar19 < (int)uVar25) {
        uVar12 = uVar19;
      }
      if ((int)uVar12 < 0) {
LAB_004c1da1:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x131,"int Abc_LitNot(int)");
      }
      uVar23 = uVar25;
      if ((int)uVar25 < (int)uVar19) {
        uVar23 = uVar19;
      }
      Vec_IntPush(pVVar15,uVar12 ^ 1);
      Vec_IntPush(pVVar15,uVar23 ^ 1);
      iVar13 = Fxch_ManComputeLevelCube(pFxchMan,pVVar15);
      iVar13 = iVar13 + 1;
    }
    else {
      pVVar15 = Vec_WecPushLevel(pFxchMan->vCubes);
      Vec_IntPush(pVVar15,iVar11);
      iVar13 = pFxchMan->nSizeOutputID;
      if (0 < (long)iVar13) {
        pVVar8 = pFxchMan->vOutputID;
        piVar9 = pFxchMan->pTempOutputID;
        lVar32 = 0;
        do {
          Vec_IntPush(pVVar8,piVar9[lVar32]);
          lVar32 = lVar32 + 1;
        } while (iVar13 != lVar32);
      }
      lVar32 = (long)pFxchMan->vCubes->nSize;
      if (lVar32 < 2) goto LAB_004c1d25;
      pVVar8 = pFxchMan->vCubes->pArray;
      pVVar17 = pVVar8 + lVar32 + -2;
      Fxch_DivSepareteCubes(pFxchMan->vDiv,pVVar17,pVVar15);
      iVar14 = Fxch_ManComputeLevelCube(pFxchMan,pVVar17);
      iVar13 = Fxch_ManComputeLevelCube(pFxchMan,pVVar15);
      if (iVar13 < iVar14) {
        iVar13 = iVar14;
      }
      pVVar10 = pFxchMan->vCubes->pArray;
      if ((pVVar17 < pVVar10) || (pVVar10 + pFxchMan->vCubes->nSize <= pVVar17)) {
LAB_004c1d63:
        __assert_fail("p->pArray <= vLevel && vLevel < p->pArray + p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0xba,"int Vec_WecLevelId(Vec_Wec_t *, Vec_Int_t *)");
      }
      Vec_IntPush(pFxchMan->vCubesToUpdate,(int)((ulong)((long)pVVar17 - (long)pVVar10) >> 4));
      pVVar10 = pFxchMan->vCubes->pArray;
      if ((pVVar15 < pVVar10) || (pVVar10 + pFxchMan->vCubes->nSize <= pVVar15)) goto LAB_004c1d63;
      Vec_IntPush(pFxchMan->vCubesToUpdate,(int)((ulong)((long)pVVar15 - (long)pVVar10) >> 4));
      if (1 < pVVar8[lVar32 + -2].nSize) {
        lVar30 = 1;
        do {
          pVVar10 = pFxchMan->vCubes->pArray;
          if ((pVVar17 < pVVar10) || (pVVar10 + pFxchMan->vCubes->nSize <= pVVar17))
          goto LAB_004c1d63;
          uVar12 = pVVar8[lVar32 + -2].pArray[lVar30];
          pVVar6 = pFxchMan->vLits;
          if (pVVar6->nSize <= (int)uVar12) {
            iVar28 = uVar12 + 1;
            iVar14 = pVVar6->nSize * 2;
            if (iVar14 <= iVar28) {
              iVar14 = iVar28;
            }
            if (pVVar6->nCap < iVar14) {
              sVar22 = (long)iVar14 << 4;
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar16 = (Vec_Int_t *)malloc(sVar22);
              }
              else {
                pVVar16 = (Vec_Int_t *)realloc(pVVar6->pArray,sVar22);
              }
              pVVar6->pArray = pVVar16;
              memset(pVVar16 + pVVar6->nCap,0,((long)iVar14 - (long)pVVar6->nCap) * 0x10);
              pVVar6->nCap = iVar14;
            }
            pVVar6->nSize = iVar28;
          }
          if (((int)uVar12 < 0) || (pVVar6->nSize <= (int)uVar12)) goto LAB_004c1d25;
          Vec_IntPush(pVVar6->pArray + uVar12,(int)((ulong)((long)pVVar17 - (long)pVVar10) >> 4));
          lVar30 = lVar30 + 1;
        } while (lVar30 < pVVar8[lVar32 + -2].nSize);
      }
      iVar13 = iVar13 + 2;
      if (1 < pVVar15->nSize) {
        lVar32 = 1;
        do {
          pVVar8 = pFxchMan->vCubes->pArray;
          if ((pVVar15 < pVVar8) || (pVVar8 + pFxchMan->vCubes->nSize <= pVVar15))
          goto LAB_004c1d63;
          uVar12 = pVVar15->pArray[lVar32];
          pVVar6 = pFxchMan->vLits;
          if (pVVar6->nSize <= (int)uVar12) {
            iVar28 = uVar12 + 1;
            iVar14 = pVVar6->nSize * 2;
            if (iVar14 <= iVar28) {
              iVar14 = iVar28;
            }
            if (pVVar6->nCap < iVar14) {
              sVar22 = (long)iVar14 << 4;
              if (pVVar6->pArray == (Vec_Int_t *)0x0) {
                pVVar17 = (Vec_Int_t *)malloc(sVar22);
              }
              else {
                pVVar17 = (Vec_Int_t *)realloc(pVVar6->pArray,sVar22);
              }
              pVVar6->pArray = pVVar17;
              memset(pVVar17 + pVVar6->nCap,0,((long)iVar14 - (long)pVVar6->nCap) * 0x10);
              pVVar6->nCap = iVar14;
            }
            pVVar6->nSize = iVar28;
          }
          if (((int)uVar12 < 0) || (pVVar6->nSize <= (int)uVar12)) goto LAB_004c1d25;
          Vec_IntPush(pVVar6->pArray + uVar12,(int)((ulong)((long)pVVar15 - (long)pVVar8) >> 4));
          lVar32 = lVar32 + 1;
        } while (lVar32 < pVVar15->nSize);
      }
    }
    if (pFxchMan->vLevels->nSize != iVar11) {
      __assert_fail("Vec_IntSize( pFxchMan->vLevels ) == iVarNew",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x23c,"int Fxch_ManCreateCube(Fxch_Man_t *, int, int)");
    }
    Vec_IntPush(pFxchMan->vLevels,iVar13);
    pFxchMan->nLits = pFxchMan->nLits + pFxchMan->vDiv->nSize;
    Vec_WecPushLevel(pFxchMan->vLits);
    Vec_WecPushLevel(pFxchMan->vLits);
    lVar32 = (long)pFxchMan->vLits->nSize;
    if (lVar32 < 2) goto LAB_004c1d25;
    pVVar15 = pFxchMan->vCubesS;
    if (0 < pVVar15->nSize) {
      pVVar8 = pFxchMan->vLits->pArray;
      lVar30 = 0;
      do {
        iVar13 = pVVar15->pArray[lVar30];
        if (((long)iVar13 < 0) || (pFxchMan->vCubes->nSize <= iVar13)) goto LAB_004c1d25;
        if ((int)uVar19 < 0) goto LAB_004c1da1;
        pVVar15 = pFxchMan->vCubes->pArray + iVar13;
        iVar14 = pVVar15->nSize;
        uVar18 = (ulong)iVar14;
        iVar28 = 0;
        if (1 < (long)uVar18) {
          piVar9 = pVVar15->pArray;
          if ((piVar9[1] ^ uVar19) == 1) {
            bVar34 = true;
            uVar27 = 1;
            uVar26 = 2;
          }
          else {
            uVar26 = 2;
            do {
              uVar27 = uVar26;
              iVar28 = 0;
              if (uVar18 == uVar27) goto LAB_004c1797;
              uVar26 = uVar27 + 1;
            } while ((piVar9[uVar27] ^ uVar19) != 1);
            bVar34 = uVar27 < uVar18;
          }
          iVar28 = 0;
          if (bVar34) {
            if ((int)uVar27 + 1 < iVar14) {
              lVar24 = 0;
              do {
                piVar9[uVar27 + lVar24] = piVar9[uVar26 + lVar24];
                iVar14 = pVVar15->nSize;
                lVar24 = lVar24 + 1;
              } while ((int)uVar26 + (int)lVar24 < iVar14);
            }
            pVVar15->nSize = iVar14 + -1;
            iVar28 = 1;
          }
        }
LAB_004c1797:
        if ((int)uVar25 < 0) goto LAB_004c1da1;
        iVar14 = pVVar15->nSize;
        uVar18 = (ulong)iVar14;
        iVar21 = 0;
        if (1 < (long)uVar18) {
          piVar9 = pVVar15->pArray;
          if ((piVar9[1] ^ uVar25) == 1) {
            bVar34 = true;
            uVar27 = 1;
            uVar26 = 2;
          }
          else {
            uVar26 = 2;
            do {
              uVar27 = uVar26;
              if (uVar18 == uVar27) goto LAB_004c182b;
              uVar26 = uVar27 + 1;
            } while ((piVar9[uVar27] ^ uVar25) != 1);
            bVar34 = uVar27 < uVar18;
          }
          if (bVar34) {
            if ((int)uVar27 + 1 < iVar14) {
              lVar24 = 0;
              do {
                piVar9[uVar27 + lVar24] = piVar9[uVar26 + lVar24];
                iVar14 = pVVar15->nSize;
                lVar24 = lVar24 + 1;
              } while ((int)lVar24 + (int)uVar26 < iVar14);
            }
            pVVar15->nSize = iVar14 + -1;
            iVar21 = 1;
          }
        }
LAB_004c182b:
        if (iVar21 + iVar28 != 2) {
          __assert_fail("RetValue == 2",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                        ,0x179,
                        "void Fxch_ManExtractDivFromCube(Fxch_Man_t *, const int, const int, const int)"
                       );
        }
        if (iVar11 < 0) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        Vec_IntPush(pVVar15,iVar11 * 2);
        pVVar17 = pFxchMan->vCubes->pArray;
        if ((pVVar15 < pVVar17) || (pVVar17 + pFxchMan->vCubes->nSize <= pVVar15))
        goto LAB_004c1d63;
        Vec_IntPush(pVVar8 + lVar32 + -2,(int)((ulong)((long)pVVar15 - (long)pVVar17) >> 4));
        Vec_IntPush(pFxchMan->vCubesToUpdate,iVar13);
        pFxchMan->nLits = pFxchMan->nLits + -1;
        lVar30 = lVar30 + 1;
        pVVar15 = pFxchMan->vCubesS;
      } while (lVar30 < pVVar15->nSize);
    }
  }
  Fxch_ManExtractDivFromCubePairs(pFxchMan,iVar11);
  if (pFxchMan->vCubesToUpdate->nSize == 0) {
    __assert_fail("Vec_IntSize( pFxchMan->vCubesToUpdate )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                  ,0x295,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
  }
  pVVar15 = pFxchMan->vCubesToUpdate;
  if (0 < pVVar15->nSize) {
    lVar32 = 0;
    do {
      iVar11 = pVVar15->pArray[lVar32];
      lVar30 = (long)iVar11;
      Fxch_ManDivSingleCube(pFxchMan,iVar11,1,1);
      if ((lVar30 < 0) || (pFxchMan->vCubes->nSize <= iVar11)) goto LAB_004c1d25;
      pVVar15 = pFxchMan->vCubes->pArray;
      if (pVVar15[lVar30].nSize < 1) goto LAB_004c1d44;
      if (*pVVar15[lVar30].pArray == 0) {
        Fxch_ManDivDoubleCube(pFxchMan,iVar11,1,1);
      }
      lVar32 = lVar32 + 1;
      pVVar15 = pFxchMan->vCubesToUpdate;
    } while (lVar32 < pVVar15->nSize);
  }
  pVVar15 = pFxchMan->vSCC;
  uVar19 = pVVar15->nSize;
  if (uVar19 != 0) {
    if ((uVar19 & 1) != 0) goto LAB_004c1e5b;
    if (3 < (int)uVar19) {
      qsort(pVVar15->pArray,(ulong)(uVar19 >> 1),8,Vec_IntSortCompare1);
      iVar11 = 2;
      if (3 < pVVar15->nSize) {
        piVar9 = pVVar15->pArray;
        iVar11 = 1;
        lVar32 = 1;
        do {
          if ((piVar9[lVar32 * 2] != piVar9[lVar32 * 2 + -2]) ||
             (piVar9[lVar32 * 2 + 1] != piVar9[lVar32 * 2 + -1])) {
            piVar9[iVar11 * 2] = piVar9[lVar32 * 2];
            piVar9[iVar11 * 2 + 1] = piVar9[lVar32 * 2 + 1];
            iVar11 = iVar11 + 1;
          }
          lVar32 = lVar32 + 1;
        } while (lVar32 < pVVar15->nSize / 2);
        iVar11 = iVar11 * 2;
      }
      pVVar15->nSize = iVar11;
    }
    if ((pFxchMan->vSCC->nSize & 1) != 0) {
      __assert_fail("Vec_IntSize( pFxchMan->vSCC ) % 2 == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/fxch/FxchMan.c"
                    ,0x2a4,"void Fxch_ManUpdate(Fxch_Man_t *, int)");
    }
    pVVar15 = pFxchMan->vSCC;
    if (1 < pVVar15->nSize) {
      lVar32 = 0;
      do {
        uVar19 = pVVar15->pArray[lVar32];
        uVar25 = pFxchMan->nSizeOutputID * uVar19;
        if ((int)uVar25 < 0) goto LAB_004c1d82;
        iVar11 = pFxchMan->vOutputID->nSize;
        if (iVar11 <= (int)uVar25) goto LAB_004c1d82;
        uVar12 = pVVar15->pArray[lVar32 + 1];
        uVar23 = pFxchMan->nSizeOutputID * uVar12;
        if (((int)uVar23 < 0) || (iVar11 <= (int)uVar23)) goto LAB_004c1d82;
        if ((int)uVar19 < 0) goto LAB_004c1d25;
        iVar11 = pFxchMan->vCubes->nSize;
        if (((iVar11 <= (int)uVar19) || ((int)uVar12 < 0)) || (iVar11 <= (int)uVar12))
        goto LAB_004c1d25;
        piVar9 = pFxchMan->vOutputID->pArray;
        pVVar15 = pFxchMan->vCubes->pArray;
        if ((pVVar15[uVar19].nCap & 0x40000000) == 0) {
          Fxch_ManDivSingleCube(pFxchMan,uVar19,0,1);
          Fxch_ManDivDoubleCube(pFxchMan,uVar19,0,1);
          pbVar1 = (byte *)((long)&pVVar15[uVar19].nCap + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        if ((pVVar15[uVar12].nCap & 0x40000000) == 0) {
          Fxch_ManDivSingleCube(pFxchMan,uVar12,0,1);
          Fxch_ManDivDoubleCube(pFxchMan,uVar12,0,1);
          pbVar1 = (byte *)((long)&pVVar15[uVar12].nCap + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        uVar3 = pFxchMan->nSizeOutputID;
        if (pVVar15[uVar19].nSize == pVVar15[uVar12].nSize) {
          if (0 < (int)uVar3) {
            lVar30 = 0;
            do {
              piVar9[(ulong)uVar23 + lVar30] =
                   piVar9[(ulong)uVar23 + lVar30] | piVar9[(ulong)uVar25 + lVar30];
              piVar9[(ulong)uVar25 + lVar30] = 0;
              lVar30 = lVar30 + 1;
            } while (lVar30 < pFxchMan->nSizeOutputID);
          }
LAB_004c1bd8:
          if (pFxchMan->vCubes->nSize <= (int)uVar19) goto LAB_004c1d25;
          pFxchMan->vCubes->pArray[uVar19].nSize = 0;
          pbVar1 = (byte *)((long)&pVVar15[uVar19].nCap + 3);
          *pbVar1 = *pbVar1 ^ 0x40;
        }
        else {
          if ((int)uVar3 < 1) goto LAB_004c1bd8;
          uVar18 = 1;
          do {
            lVar30 = uVar18 - 1;
            lVar24 = uVar18 - 1;
            if (uVar3 <= uVar18) break;
            uVar18 = uVar18 + 1;
          } while (piVar9[(ulong)uVar25 + lVar30] == piVar9[(ulong)uVar23 + lVar24]);
          if ((piVar9[(ulong)uVar25 + lVar30] == piVar9[(ulong)uVar23 + lVar24]) ||
             (pFxchMan->nSizeOutputID < 1)) goto LAB_004c1bd8;
          lVar30 = 0;
          uVar12 = 0;
          do {
            uVar12 = uVar12 | ~piVar9[(ulong)uVar23 + lVar30] & piVar9[(ulong)uVar25 + lVar30];
            piVar9[(ulong)uVar25 + lVar30] =
                 ~piVar9[(ulong)uVar23 + lVar30] & piVar9[(ulong)uVar25 + lVar30];
            lVar30 = lVar30 + 1;
          } while (lVar30 < pFxchMan->nSizeOutputID);
          if (uVar12 == 0) goto LAB_004c1bd8;
        }
        lVar32 = lVar32 + 2;
        pVVar15 = pFxchMan->vSCC;
      } while ((int)((uint)lVar32 | 1) < pVVar15->nSize);
    }
    pVVar15 = pFxchMan->vSCC;
    if (1 < pVVar15->nSize) {
      lVar32 = 1;
      do {
        iVar11 = pVVar15->pArray[lVar32 + -1];
        lVar30 = (long)iVar11;
        if (lVar30 < 0) goto LAB_004c1d25;
        iVar13 = pFxchMan->vCubes->nSize;
        if (((iVar13 <= iVar11) || (uVar19 = pVVar15->pArray[lVar32], (int)uVar19 < 0)) ||
           (iVar13 <= (int)uVar19)) goto LAB_004c1d25;
        pVVar15 = pFxchMan->vCubes->pArray;
        if ((pVVar15[lVar30].nCap & 0x40000000) != 0) {
          Fxch_ManDivSingleCube(pFxchMan,iVar11,1,1);
          Fxch_ManDivDoubleCube(pFxchMan,iVar11,1,1);
          pbVar1 = (byte *)((long)&pVVar15[lVar30].nCap + 3);
          *pbVar1 = *pbVar1 ^ 0x40;
        }
        if ((pVVar15[uVar19].nCap & 0x40000000) != 0) {
          Fxch_ManDivSingleCube(pFxchMan,uVar19,1,1);
          Fxch_ManDivDoubleCube(pFxchMan,uVar19,1,1);
          pbVar1 = (byte *)((long)&pVVar15[uVar19].nCap + 3);
          *pbVar1 = *pbVar1 ^ 0x40;
        }
        pVVar15 = pFxchMan->vSCC;
        lVar32 = lVar32 + 2;
      } while ((int)lVar32 < pVVar15->nSize);
    }
    pVVar15->nSize = 0;
  }
  pFxchMan->nExtDivs = pFxchMan->nExtDivs + 1;
  return;
}

Assistant:

void Fxch_ManUpdate( Fxch_Man_t* pFxchMan,
                     int iDiv )
{
    int i, iCube0, iCube1,
        Lit0 = -1,
        Lit1 = -1,
        iVarNew;

    Vec_Int_t* vCube0,
             * vCube1,
             * vDivCubePairs;

    /* Get the selected candidate (divisor) */
    Vec_IntClear( pFxchMan->vDiv );
    Vec_IntAppend( pFxchMan->vDiv, Hsh_VecReadEntry( pFxchMan->pDivHash, iDiv ) );

    /* Find cubes associated with the divisor */
    Vec_IntClear( pFxchMan->vCubesS );
    if ( Vec_IntSize( pFxchMan->vDiv ) == 2 )
    {
        Lit0 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 0 ) );
        Lit1 = Abc_Lit2Var( Vec_IntEntry( pFxchMan->vDiv, 1 ) );
        assert( Lit0 >= 0 && Lit1 >= 0 );

        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ) );
        Fxch_ManCompressCubes( pFxchMan->vCubes, Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ) );
        Vec_IntTwoRemoveCommon( Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit0 ) ),
                                Vec_WecEntry( pFxchMan->vLits, Abc_LitNot( Lit1 ) ),
                                pFxchMan->vCubesS );
    }

    /* Find pairs associated with the divisor */
    Vec_IntClear( pFxchMan->vPairs );
    vDivCubePairs = Vec_WecEntry( pFxchMan->vDivCubePairs, iDiv );
    Vec_IntAppend( pFxchMan->vPairs, vDivCubePairs );
    Vec_IntErase( vDivCubePairs );

    Vec_IntForEachEntryDouble( pFxchMan->vPairs, iCube0, iCube1, i )
    {
        assert( Fxch_ManGetLit( pFxchMan, iCube0, 0) == Fxch_ManGetLit( pFxchMan, iCube1, 0) );
        if (iCube0 > iCube1)
        {
            Vec_IntSetEntry( pFxchMan->vPairs, i, iCube1);
            Vec_IntSetEntry( pFxchMan->vPairs, i+1, iCube0);
        }
    }

    Vec_IntUniqifyPairs( pFxchMan->vPairs );
    assert( Vec_IntSize( pFxchMan->vPairs ) % 2 == 0 );

    /* subtract cost of single-cube divisors */
    Vec_IntForEachEntry( pFxchMan->vCubesS, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntForEachEntry( pFxchMan->vPairs, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1);

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
    }

    Vec_IntClear( pFxchMan->vCubesToUpdate );
    if ( Fxch_DivIsNotConstant1( pFxchMan->vDiv ) )
    {
        iVarNew = Fxch_ManCreateCube( pFxchMan, Lit0, Lit1 );
        Fxch_ManExtractDivFromCube( pFxchMan, Lit0, Lit1, iVarNew );
        Fxch_ManExtractDivFromCubePairs( pFxchMan, iVarNew );
    }
    else
        Fxch_ManExtractDivFromCubePairs( pFxchMan, 0 );

    assert( Vec_IntSize( pFxchMan->vCubesToUpdate ) );

    /* Add cost */
    Vec_IntForEachEntry( pFxchMan->vCubesToUpdate, iCube0, i )
    {
        Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );

        if ( Vec_WecEntryEntry( pFxchMan->vCubes, iCube0, 0 ) == 0 )
            Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
    }

    /* Deal with SCC */
    if ( Vec_IntSize( pFxchMan->vSCC ) )
    {
        Vec_IntUniqifyPairs( pFxchMan->vSCC );
        assert( Vec_IntSize( pFxchMan->vSCC ) % 2 == 0 );

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            int j, RetValue = 1;
            int* pOutputID0 = Vec_IntEntryP( pFxchMan->vOutputID, iCube0 * pFxchMan->nSizeOutputID );
            int* pOutputID1 = Vec_IntEntryP( pFxchMan->vOutputID, iCube1 * pFxchMan->nSizeOutputID );
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( !Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 0, 1 );
                Vec_WecIntSetMark( vCube0 );
            }

            if ( !Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 0, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 0, 1 );
                Vec_WecIntSetMark( vCube1 );
            }

            if ( Vec_IntSize( vCube0 ) == Vec_IntSize( vCube1 ) )
            {
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    pOutputID1[j] |= pOutputID0[j];
                    pOutputID0[j] = 0;
                }
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
                continue;
            }

            for ( j = 0; j < pFxchMan->nSizeOutputID && RetValue; j++ )
                RetValue = ( pOutputID0[j] == pOutputID1[j] );

            if ( RetValue )
            {
                Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                Vec_WecIntXorMark( vCube0 );
            }
            else
            {
                RetValue = 0;
                for ( j = 0; j < pFxchMan->nSizeOutputID; j++ )
                {
                    RetValue |= ( pOutputID0[j] & ~( pOutputID1[j] ) );
                    pOutputID0[j] &= ~( pOutputID1[j] );
                }

                if ( RetValue == 0 )
                {
                    Vec_IntClear( Vec_WecEntry( pFxchMan->vCubes, iCube0 ) );
                    Vec_WecIntXorMark( vCube0 );
                }
            }
        }

        Vec_IntForEachEntryDouble( pFxchMan->vSCC, iCube0, iCube1, i )
        {
            vCube0 = Vec_WecEntry( pFxchMan->vCubes, iCube0 );
            vCube1 = Vec_WecEntry( pFxchMan->vCubes, iCube1 );

            if ( Vec_WecIntHasMark( vCube0 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube0, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube0, 1, 1 );
                Vec_WecIntXorMark( vCube0 );
            }

            if ( Vec_WecIntHasMark( vCube1 ) )
            {
                Fxch_ManDivSingleCube( pFxchMan, iCube1, 1, 1 );
                Fxch_ManDivDoubleCube( pFxchMan, iCube1, 1, 1 );
                Vec_WecIntXorMark( vCube1 );
            }
        }

        Vec_IntClear( pFxchMan->vSCC );
    }

    pFxchMan->nExtDivs++;
}